

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateSSEImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateSSEImpl<double,2,0>::accumulateDerivativesDispatch2<false,true>
          (BeagleCPU4StateSSEImpl<double,2,0> *this,double *outDerivatives,double *outSumDerivatives
          ,double *outSumSquaredDerivatives)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  double dVar5;
  double dVar7;
  undefined1 auVar6 [16];
  double dVar8;
  double dVar10;
  undefined1 auVar9 [16];
  double dVar11;
  double dVar14;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  
  if (outSumSquaredDerivatives != (double *)0x0) {
    dVar5 = 0.0;
    dVar7 = 0.0;
    dVar8 = 0.0;
    dVar10 = 0.0;
    for (lVar4 = 0; lVar4 < (long)*(int *)(this + 0x14) + -1; lVar4 = lVar4 + 2) {
      pdVar1 = (double *)(*(long *)(this + 0x80) + lVar4 * 8);
      dVar2 = *pdVar1;
      dVar3 = pdVar1[1];
      auVar9 = vdivpd_avx(*(undefined1 (*) [16])(*(long *)(this + 0x100) + lVar4 * 8),
                          *(undefined1 (*) [16])(*(long *)(this + 0xf8) + lVar4 * 8));
      dVar11 = auVar9._0_8_;
      dVar14 = auVar9._8_8_;
      dVar8 = dVar8 + dVar11 * dVar2;
      dVar10 = dVar10 + dVar14 * dVar3;
      dVar5 = dVar5 + dVar11 * dVar11 * dVar2;
      dVar7 = dVar7 + dVar14 * dVar14 * dVar3;
    }
    auVar9._0_8_ = dVar8 + dVar10;
    auVar9._8_8_ = dVar8 + dVar10;
    auVar6._0_8_ = dVar5 + dVar7;
    auVar6._8_8_ = dVar5 + dVar7;
    while (lVar4 < *(int *)(this + 0x14)) {
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)(*(long *)(this + 0x80) + lVar4 * 8);
      auVar12._0_8_ =
           *(double *)(*(long *)(this + 0x100) + lVar4 * 8) /
           *(double *)(*(long *)(this + 0xf8) + lVar4 * 8);
      auVar12._8_8_ = 0;
      lVar4 = lVar4 + 1;
      auVar9 = vfmadd231sd_fma(auVar9,auVar12,auVar15);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = auVar12._0_8_ * auVar12._0_8_;
      auVar6 = vfmadd231sd_fma(auVar6,auVar15,auVar13);
    }
    *outSumDerivatives = auVar9._0_8_;
    *outSumSquaredDerivatives = auVar6._0_8_;
    return;
  }
  accumulateDerivativesImpl<false,true,false>(this,outDerivatives,outSumDerivatives,(double *)0x0);
  return;
}

Assistant:

void BeagleCPU4StateSSEImpl<BEAGLE_CPU_4_SSE_DOUBLE>::accumulateDerivativesDispatch2(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    if (outSumSquaredDerivatives == NULL) {
        accumulateDerivativesImpl<DoDerivatives, DoSum, false>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    } else {
        accumulateDerivativesImpl<DoDerivatives, DoSum, true>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    }
}